

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FloatToSink<long_double>
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  Decomposed<long_double> decomposed_00;
  Decomposed<long_double> decomposed_01;
  uint128 mantissa;
  uint128 mantissa_00;
  char cVar1;
  bool bVar2;
  FormatConversionChar FVar3;
  int iVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  FormatSinkImpl *in_R9;
  string_view str;
  HexFloatTypeParams float_traits;
  undefined6 uVar7;
  char local_1e9;
  char local_1e1;
  size_t local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  FormatState local_1c8;
  char *local_1a8;
  HexFloatTypeParams local_190;
  byte local_179;
  char *pcStack_178;
  bool uppercase;
  unsigned_long local_150;
  char *local_148;
  FormatState local_128;
  char *local_108;
  FormatConversionChar local_f1;
  undefined1 local_f0 [7];
  FormatConversionChar c;
  Buffer buffer;
  Decomposed<long_double> decomposed;
  int local_5c;
  size_t sStack_58;
  int exp;
  size_t precision;
  undefined1 auStack_48 [7];
  char sign_char;
  longdouble abs_v;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  longdouble v_local;
  
  _conv_local = v;
  _auStack_48 = v;
  precision._7_1_ = '\0';
  unique0x10000566 = sink;
  sink_local = (FormatSinkImpl *)conv;
  bVar2 = std::signbit(v);
  if (bVar2) {
    precision._7_1_ = '-';
    _auStack_48 = -_auStack_48;
  }
  else {
    bVar2 = FormatConversionSpecImpl::has_show_pos_flag((FormatConversionSpecImpl *)sink_local);
    if (bVar2) {
      precision._7_1_ = '+';
    }
    else {
      bVar2 = FormatConversionSpecImpl::has_sign_col_flag((FormatConversionSpecImpl *)sink_local);
      if (bVar2) {
        precision._7_1_ = ' ';
      }
    }
  }
  bVar2 = ConvertNonNumericFloats<long_double>
                    (precision._7_1_,_auStack_48,(FormatConversionSpecImpl *)sink_local,
                     stack0xffffffffffffffc8);
  if (!bVar2) {
    iVar4 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)sink_local);
    if (iVar4 < 0) {
      local_1e0 = 6;
    }
    else {
      iVar4 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)sink_local);
      local_1e0 = (size_t)iVar4;
    }
    sStack_58 = local_1e0;
    local_5c = 0;
    Decompose<long_double>((Decomposed<long_double> *)&buffer.end,_auStack_48);
    local_f1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
    if ((local_f1 == 8) || (local_f1 == 9)) {
      local_108 = buffer.end;
      local_128.sign_char = precision._7_1_;
      local_128.precision = sStack_58;
      local_128.conv = (FormatConversionSpecImpl *)sink_local;
      local_128.sink = stack0xffffffffffffffc8;
      mantissa_00.hi_ = decomposed.mantissa.lo_;
      mantissa_00.lo_ = (uint64_t)buffer.end;
      FormatF<absl::lts_20250127::uint128>(mantissa_00,(int)decomposed.mantissa.hi_,&local_128);
    }
    else {
      uVar7 = (undefined6)(decomposed.mantissa.lo_ >> 0x10);
      if ((local_f1 == 10) || (local_f1 == 0xb)) {
        local_148 = buffer.end;
        decomposed_00._20_4_ = decomposed.mantissa.hi_._4_4_;
        decomposed_00.exponent = (int)decomposed.mantissa.hi_;
        decomposed_00.mantissa.hi_._0_2_ = (short)decomposed.mantissa.lo_;
        decomposed_00.mantissa.lo_ = (uint64_t)buffer.end;
        decomposed_00.mantissa.hi_._2_6_ = uVar7;
        decomposed_00._24_8_ = decomposed._16_8_;
        bVar2 = str_format_internal::(anonymous_namespace)::
                FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                          (decomposed_00,sStack_58,(Buffer *)local_f0,&local_5c);
        if (!bVar2) {
          bVar2 = FallbackToSnprintf<long_double>
                            (_conv_local,(FormatConversionSpecImpl *)sink_local,
                             stack0xffffffffffffffc8);
          return bVar2;
        }
        bVar2 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)sink_local);
        if ((!bVar2) && (pcVar5 = Buffer::back((Buffer *)local_f0), *pcVar5 == '.')) {
          Buffer::pop_back((Buffer *)local_f0);
        }
        iVar4 = local_5c;
        FVar3 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
        bVar2 = FormatConversionCharIsUpper(FVar3);
        local_1e1 = 'E';
        if (!bVar2) {
          local_1e1 = 'e';
        }
        PrintExponent(iVar4,local_1e1,(Buffer *)local_f0);
      }
      else {
        if ((local_f1 != 0xc) && (local_f1 != 0xd)) {
          if ((local_f1 != 0xe) && (local_f1 != 0xf)) {
            return false;
          }
          local_179 = local_f1 == 0xf;
          HexFloatTypeParams::HexFloatTypeParams<long_double>(&local_190,(longdouble)0);
          local_1a8 = buffer.end;
          local_1c8.sign_char = precision._7_1_;
          local_1c8.precision = sStack_58;
          local_1c8.conv = (FormatConversionSpecImpl *)sink_local;
          local_1c8.sink = stack0xffffffffffffffc8;
          float_traits._4_4_ = 0;
          float_traits.min_exponent = local_190.min_exponent;
          mantissa.hi_ = decomposed.mantissa.lo_;
          mantissa.lo_ = (uint64_t)buffer.end;
          float_traits.leading_digit_size_bits = local_190.leading_digit_size_bits;
          FormatA<absl::lts_20250127::uint128>
                    (float_traits,mantissa,(int)decomposed.mantissa.hi_,(bool)(local_179 & 1),
                     &local_1c8);
          return true;
        }
        local_150 = 1;
        puVar6 = std::max<unsigned_long>(&stack0xffffffffffffffa8,&local_150);
        sStack_58 = *puVar6 - 1;
        pcStack_178 = buffer.end;
        decomposed_01._20_4_ = decomposed.mantissa.hi_._4_4_;
        decomposed_01.exponent = (int)decomposed.mantissa.hi_;
        decomposed_01.mantissa.hi_._0_2_ = (short)decomposed.mantissa.lo_;
        decomposed_01.mantissa.lo_ = (uint64_t)buffer.end;
        decomposed_01.mantissa.hi_._2_6_ = uVar7;
        decomposed_01._24_8_ = decomposed._16_8_;
        bVar2 = str_format_internal::(anonymous_namespace)::
                FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                          (decomposed_01,sStack_58,(Buffer *)local_f0,&local_5c);
        if (!bVar2) {
          bVar2 = FallbackToSnprintf<long_double>
                            (_conv_local,(FormatConversionSpecImpl *)sink_local,
                             stack0xffffffffffffffc8);
          return bVar2;
        }
        if (((local_5c < 0) || ((ulong)(long)local_5c < sStack_58 + 1)) && (-5 < local_5c)) {
          if (local_5c < 0) {
            *(undefined1 *)(buffer._80_8_ + 1) = *(undefined1 *)buffer._80_8_;
            for (; local_5c < -1; local_5c = local_5c + 1) {
              *(undefined1 *)buffer._80_8_ = 0x30;
              buffer._80_8_ = buffer._80_8_ + -1;
            }
            *(undefined1 *)buffer._80_8_ = 0x2e;
            *(undefined1 *)(buffer._80_8_ + -1) = 0x30;
            buffer._80_8_ = (undefined1 *)(buffer._80_8_ + -1);
          }
          else if (0 < local_5c) {
            std::_V2::rotate<char*>
                      ((char *)(buffer._80_8_ + 1),(char *)(buffer._80_8_ + 2),
                       (char *)(buffer._80_8_ + (long)local_5c + 2));
          }
          local_5c = 0;
        }
        bVar2 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)sink_local);
        if (!bVar2) {
          while( true ) {
            pcVar5 = Buffer::back((Buffer *)local_f0);
            if (*pcVar5 != '0') break;
            Buffer::pop_back((Buffer *)local_f0);
          }
          pcVar5 = Buffer::back((Buffer *)local_f0);
          if (*pcVar5 == '.') {
            Buffer::pop_back((Buffer *)local_f0);
          }
        }
        iVar4 = local_5c;
        if (local_5c != 0) {
          FVar3 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)sink_local);
          bVar2 = FormatConversionCharIsUpper(FVar3);
          local_1e9 = 'E';
          if (!bVar2) {
            local_1e9 = 'e';
          }
          PrintExponent(iVar4,local_1e9,(Buffer *)local_f0);
        }
      }
      cVar1 = precision._7_1_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1d8,(char *)buffer._80_8_,(long)buffer.begin - buffer._80_8_);
      str._M_str = (char *)sink_local;
      str._M_len = (size_t)local_1d8._M_str;
      WriteBufferToSink((anon_unknown_0 *)(ulong)(uint)(int)cVar1,(char)local_1d8._M_len,str,
                        (FormatConversionSpecImpl *)stack0xffffffffffffffc8,in_R9);
    }
  }
  return true;
}

Assistant:

bool FloatToSink(const Float v, const FormatConversionSpecImpl &conv,
                 FormatSinkImpl *sink) {
  // Print the sign or the sign column.
  Float abs_v = v;
  char sign_char = 0;
  if (std::signbit(abs_v)) {
    sign_char = '-';
    abs_v = -abs_v;
  } else if (conv.has_show_pos_flag()) {
    sign_char = '+';
  } else if (conv.has_sign_col_flag()) {
    sign_char = ' ';
  }

  // Print nan/inf.
  if (ConvertNonNumericFloats(sign_char, abs_v, conv, sink)) {
    return true;
  }

  size_t precision =
      conv.precision() < 0 ? 6 : static_cast<size_t>(conv.precision());

  int exp = 0;

  auto decomposed = Decompose(abs_v);

  Buffer buffer;

  FormatConversionChar c = conv.conversion_char();

  if (c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::F) {
    FormatF(decomposed.mantissa, decomposed.exponent,
            {sign_char, precision, conv, sink});
    return true;
  } else if (c == FormatConversionCharInternal::e ||
             c == FormatConversionCharInternal::E) {
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if (!conv.has_alt_flag() && buffer.back() == '.') buffer.pop_back();
    PrintExponent(
        exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
        &buffer);
  } else if (c == FormatConversionCharInternal::g ||
             c == FormatConversionCharInternal::G) {
    precision = std::max(precision, size_t{1}) - 1;
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if ((exp < 0 || precision + 1 > static_cast<size_t>(exp)) && exp >= -4) {
      if (exp < 0) {
        // Have 1.23456, needs 0.00123456
        // Move the first digit
        buffer.begin[1] = *buffer.begin;
        // Add some zeros
        for (; exp < -1; ++exp) *buffer.begin-- = '0';
        *buffer.begin-- = '.';
        *buffer.begin = '0';
      } else if (exp > 0) {
        // Have 1.23456, needs 1234.56
        // Move the '.' exp positions to the right.
        std::rotate(buffer.begin + 1, buffer.begin + 2, buffer.begin + exp + 2);
      }
      exp = 0;
    }
    if (!conv.has_alt_flag()) {
      while (buffer.back() == '0') buffer.pop_back();
      if (buffer.back() == '.') buffer.pop_back();
    }
    if (exp) {
      PrintExponent(
          exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
          &buffer);
    }
  } else if (c == FormatConversionCharInternal::a ||
             c == FormatConversionCharInternal::A) {
    bool uppercase = (c == FormatConversionCharInternal::A);
    FormatA(HexFloatTypeParams(Float{}), decomposed.mantissa,
            decomposed.exponent, uppercase, {sign_char, precision, conv, sink});
    return true;
  } else {
    return false;
  }

  WriteBufferToSink(
      sign_char,
      absl::string_view(buffer.begin,
                        static_cast<size_t>(buffer.end - buffer.begin)),
      conv, sink);

  return true;
}